

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_dictionary_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_add,"Dictionary::add:");
  sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_atOrNil,"Dictionary::atOrNil:")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_atPut,"Dictionary::at:put:");
  sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_at,"Dictionary::at:");
  sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_scanFor,"Dictionary::scanFor:")
  ;
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_add,"IdentityDictionary::add:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_associationAtOrNil,
             "IdentityDictionary::associationAtOrNil:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_atOrNil,"IdentityDictionary::atOrNil:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_atPut,"IdentityDictionary::at:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_at,"IdentityDictionary::at:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_identityDictionary_primitive_scanFor,"IdentityDictionary::scanFor:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_weakValueDictionary_primitive_atOrNil,"WeakValueDictionary::atOrNil:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_weakValueDictionary_primitive_atPut,"WeakValueDictionary::at:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_weakValueDictionary_primitive_at,"WeakValueDictionary::at:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_methodDictionary_primitive_new,"MethodDictionary::new");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_methodDictionary_primitive_atOrNil,"MethodDictionary::atOrNil:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_methodDictionary_primitive_at,"MethodDictionary::at:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_methodDictionary_primitive_atPut,"MethodDictionary::at:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_methodDictionary_primitive_scanFor,"MethodDictionary::scanFor:");
  return;
}

Assistant:

void sysbvm_dictionary_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_add, "Dictionary::add:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_atOrNil, "Dictionary::atOrNil:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_atPut, "Dictionary::at:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_at, "Dictionary::at:");
    sysbvm_primitiveTable_registerFunction(sysbvm_dictionary_primitive_scanFor, "Dictionary::scanFor:");

    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_add, "IdentityDictionary::add:");
    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_associationAtOrNil, "IdentityDictionary::associationAtOrNil:");
    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_atOrNil, "IdentityDictionary::atOrNil:");
    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_atPut, "IdentityDictionary::at:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_at, "IdentityDictionary::at:");
    sysbvm_primitiveTable_registerFunction(sysbvm_identityDictionary_primitive_scanFor, "IdentityDictionary::scanFor:");

    sysbvm_primitiveTable_registerFunction(sysbvm_weakValueDictionary_primitive_atOrNil, "WeakValueDictionary::atOrNil:");
    sysbvm_primitiveTable_registerFunction(sysbvm_weakValueDictionary_primitive_atPut, "WeakValueDictionary::at:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_weakValueDictionary_primitive_at, "WeakValueDictionary::at:");

    sysbvm_primitiveTable_registerFunction(sysbvm_methodDictionary_primitive_new, "MethodDictionary::new");
    sysbvm_primitiveTable_registerFunction(sysbvm_methodDictionary_primitive_atOrNil, "MethodDictionary::atOrNil:");
    sysbvm_primitiveTable_registerFunction(sysbvm_methodDictionary_primitive_at, "MethodDictionary::at:");
    sysbvm_primitiveTable_registerFunction(sysbvm_methodDictionary_primitive_atPut, "MethodDictionary::at:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_methodDictionary_primitive_scanFor, "MethodDictionary::scanFor:");
}